

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

shared_ptr<helics::helicsCLI11App> __thiscall helics::CoreBroker::generateCLI(CoreBroker *this)

{
  element_type *__s;
  undefined8 option_name;
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar1;
  Option *tfed;
  shared_ptr<helics::helicsCLI11App> *app;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffe48;
  Option *opt;
  function<void_()> *in_stack_fffffffffffffe50;
  char (*in_stack_fffffffffffffe68) [18];
  allocator<char> *in_stack_fffffffffffffe70;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  undefined1 local_141 [80];
  allocator<char> local_f1 [25];
  string *in_stack_ffffffffffffff28;
  function<void_()> *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  App *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  App *in_stack_ffffffffffffff60;
  helicsCLI11App *in_stack_ffffffffffffffb0;
  
  std::make_shared<helics::helicsCLI11App,char_const(&)[18]>(in_stack_fffffffffffffe68);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x60684f);
  helicsCLI11App::remove_helics_specifics(in_stack_ffffffffffffffb0);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x606863);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::function<void()>::function<helics::CoreBroker::generateCLI()::__0,void>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  CLI::App::add_flag_callback
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(in_stack_fffffffffffffe40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  std::function<void_()>::~function((function<void_()> *)0x60692f);
  std::__cxx11::string::~string(in_stack_fffffffffffffe40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  __s = CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x606953);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff37;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,in_stack_fffffffffffffe70);
  __a = local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  option_name = CLI::App::
                add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                          (in_stack_ffffffffffffff60,(string *)in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff50,(string *)in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(in_stack_fffffffffffffe40);
  std::allocator<char>::~allocator(local_f1);
  std::__cxx11::string::~string(in_stack_fffffffffffffe40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  this_00 = CLI::std::
            __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x606a33);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0xdc0);
  opt = (Option *)local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffff60,(string *)option_name,
             (TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff50,
             (string *)in_stack_ffffffffffffff48);
  CLI::Option::needs((Option *)this_00,opt);
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator((allocator<char> *)local_141);
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator((allocator<char> *)(local_141 + 0x28));
  sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> CoreBroker::generateCLI()
{
    auto app = std::make_shared<helicsCLI11App>("Option for Broker");
    app->remove_helics_specifics();
    app->add_flag_callback(
        "--root", [this]() { setAsRoot(); }, "specify whether the broker is a root");
    auto* tfed = app->add_option(
        "--timemonitor",
        mTimeMonitorFederate,
        "specify a federate to use as the primary time monitor for logging and indicator purpose, it has no actual impact on the cosimulation");
    app->add_option("--timemonitorperiod",
                    mTimeMonitorPeriod,
                    "period to display logs of times from the time monitor federate")
        ->needs(tfed);
    return app;
}